

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

MIR_reg_t get_new_ssa_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,int sep,int new_p)

{
  VARR_size_t *varr;
  size_t *psVar1;
  MIR_context_t ctx;
  MIR_func_t func;
  VARR_char *pVVar2;
  size_t sVar3;
  MIR_type_t type;
  size_t sVar4;
  char *pcVar5;
  char *hard_reg_name;
  size_t sVar6;
  MIR_reg_t MVar7;
  uint uVar8;
  ulong uVar9;
  char local_58 [40];
  
  uVar9 = (ulong)reg;
  while( true ) {
    sVar4 = VARR_size_tlength(gen_ctx->ssa_ctx->curr_reg_indexes);
    varr = gen_ctx->ssa_ctx->curr_reg_indexes;
    if (uVar9 < sVar4) break;
    VARR_size_tpush(varr,0);
  }
  if (((varr != (VARR_size_t *)0x0) && (psVar1 = varr->varr, psVar1 != (size_t *)0x0)) &&
     (uVar9 < varr->els_num)) {
    sVar4 = psVar1[uVar9];
    psVar1[uVar9] = sVar4 + 1;
    if ((new_p == 0) && (sVar4 == 0)) {
      return 0xffffffff;
    }
    ctx = gen_ctx->ctx;
    MVar7 = reg - 0x21;
    func = (gen_ctx->curr_func_item->u).func;
    type = MIR_reg_type(ctx,MVar7,func);
    pcVar5 = MIR_reg_name(ctx,MVar7,func);
    hard_reg_name = MIR_reg_hard_reg_name(ctx,MVar7,func);
    pVVar2 = gen_ctx->ssa_ctx->reg_name;
    if ((pVVar2 == (VARR_char *)0x0) || (pVVar2->varr == (char *)0x0)) {
      pcVar5 = "trunc";
    }
    else {
      pVVar2->els_num = 0;
      sVar6 = strlen(pcVar5);
      VARR_charpush_arr(pVVar2,pcVar5,sVar6);
      pVVar2 = gen_ctx->ssa_ctx->reg_name;
      VARR_charexpand(pVVar2,pVVar2->els_num + 1);
      sVar3 = pVVar2->els_num;
      pVVar2->els_num = sVar3 + 1;
      pVVar2->varr[sVar3] = (char)sep;
      sprintf(local_58,"%lu",sVar4);
      pVVar2 = gen_ctx->ssa_ctx->reg_name;
      sVar6 = strlen(local_58);
      VARR_charpush_arr(pVVar2,local_58,sVar6 + 1);
      pVVar2 = gen_ctx->ssa_ctx->reg_name;
      if (pVVar2 != (VARR_char *)0x0) {
        pcVar5 = pVVar2->varr;
        if (hard_reg_name == (char *)0x0) {
          MVar7 = MIR_new_func_reg(ctx,func,type,pcVar5);
          uVar8 = MVar7 + 0x21;
        }
        else {
          MVar7 = MIR_new_global_func_reg(ctx,func,type,pcVar5,hard_reg_name);
          uVar8 = MVar7 + 0x21;
          bitmap_set_bit_p(gen_ctx->tied_regs,(ulong)uVar8);
        }
        if (uVar8 == 0xffffffff) {
          return 0xffffffff;
        }
        if (uVar8 <= gen_ctx->curr_cfg->max_var) {
          return uVar8;
        }
        gen_ctx->curr_cfg->max_var = uVar8;
        return uVar8;
      }
      pcVar5 = "addr";
    }
    mir_varr_assert_fail(pcVar5,"char");
  }
  mir_varr_assert_fail("get","size_t");
}

Assistant:

static MIR_reg_t get_new_ssa_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, int sep, int new_p) {
  size_t reg_index;

  while (VARR_LENGTH (size_t, curr_reg_indexes) <= reg) VARR_PUSH (size_t, curr_reg_indexes, 0);
  reg_index = VARR_GET (size_t, curr_reg_indexes, reg);
  VARR_SET (size_t, curr_reg_indexes, reg, reg_index + 1);
  return reg_index == 0 && !new_p ? MIR_NON_VAR : get_new_reg (gen_ctx, reg, sep, reg_index);
}